

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlChar * xmlBufferDetach(xmlBufferPtr buf)

{
  xmlBufferPtr local_20;
  xmlChar *ret;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local = (xmlBufferPtr)0x0;
  }
  else {
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->content != buf->contentIO)) {
      local_20 = (xmlBufferPtr)xmlStrndup(buf->content,buf->use);
      (*xmlFree)(buf->contentIO);
    }
    else {
      local_20 = (xmlBufferPtr)buf->content;
    }
    buf->contentIO = (xmlChar *)0x0;
    buf->content = (xmlChar *)0x0;
    buf->size = 0;
    buf->use = 0;
    buf_local = local_20;
  }
  return (xmlChar *)buf_local;
}

Assistant:

xmlChar *
xmlBufferDetach(xmlBufferPtr buf) {
    xmlChar *ret;

    if (buf == NULL)
        return(NULL);

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
        (buf->content != buf->contentIO)) {
        ret = xmlStrndup(buf->content, buf->use);
        xmlFree(buf->contentIO);
    } else {
        ret = buf->content;
    }

    buf->contentIO = NULL;
    buf->content = NULL;
    buf->size = 0;
    buf->use = 0;

    return ret;
}